

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchOut.cpp
# Opt level: O2

int Bmatch_Output(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,vector<Node,_std::allocator<Node>_> *inGroup,
                 vector<Node,_std::allocator<Node>_> *outGroup,
                 vector<Node,_std::allocator<Node>_> *constGroup,int *maxScore,char *filename)

{
  char cVar1;
  Abc_Obj_t *pAVar2;
  ostream *poVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  int j;
  ulong uVar7;
  int j_2;
  vector<Node,_std::allocator<Node>_> *pvVar8;
  pointer *ppNVar9;
  long lVar10;
  ofstream f;
  
  ppNVar9 = &(outGroup->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  iVar6 = 0;
  for (lVar10 = 0; lVar10 < pNtk1->vPos->nSize; lVar10 = lVar10 + 1) {
    Abc_NtkPo(pNtk1,(int)lVar10);
    iVar5 = (int)((ulong)((long)*ppNVar9 - (long)((_Vector_impl_data *)(ppNVar9 + -1))->_M_start) >>
                 3) + 0xb;
    if (*ppNVar9 == ((_Vector_impl_data *)(ppNVar9 + -1))->_M_start) {
      iVar5 = 0;
    }
    iVar6 = iVar5 + iVar6;
    ppNVar9 = ppNVar9 + 3;
  }
  if (*maxScore < iVar6) {
    std::ofstream::ofstream((ostream *)&f,filename,_S_out);
    for (lVar10 = 0; lVar10 < pNtk1->vPos->nSize; lVar10 = lVar10 + 1) {
      pAVar2 = Abc_NtkPo(pNtk1,(int)lVar10);
      if (outGroup[lVar10].super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          outGroup[lVar10].super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
          super__Vector_impl_data._M_start) {
        poVar3 = std::operator<<((ostream *)&f,"OUTGROUP");
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&f,"1 + ");
        pcVar4 = Abc_ObjName(pAVar2);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        pvVar8 = outGroup + lVar10;
        for (uVar7 = 0;
            uVar7 < (ulong)((long)(pvVar8->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)(pvVar8->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                                  super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
          poVar3 = std::operator<<((ostream *)&f,"2 ");
          pcVar4 = "+ ";
          if ((pvVar8->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar7].inv != false) {
            pcVar4 = "- ";
          }
          poVar3 = std::operator<<(poVar3,pcVar4);
          pAVar2 = Abc_NtkPo(pNtk2,(pvVar8->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl
                                   .super__Vector_impl_data._M_start[uVar7].id);
          pcVar4 = Abc_ObjName(pAVar2);
          poVar3 = std::operator<<(poVar3,pcVar4);
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        poVar3 = std::operator<<((ostream *)&f,"END");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
    }
    for (lVar10 = 0; lVar10 < pNtk1->vPis->nSize; lVar10 = lVar10 + 1) {
      pAVar2 = Abc_NtkPi(pNtk1,(int)lVar10);
      if (inGroup[lVar10].super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          inGroup[lVar10].super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
          super__Vector_impl_data._M_start) {
        poVar3 = std::operator<<((ostream *)&f,"INGROUP");
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&f,"1 + ");
        pcVar4 = Abc_ObjName(pAVar2);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        pvVar8 = inGroup + lVar10;
        for (uVar7 = 0;
            uVar7 < (ulong)((long)(pvVar8->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)(pvVar8->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                                  super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
          poVar3 = std::operator<<((ostream *)&f,"2 ");
          pcVar4 = "+ ";
          if ((pvVar8->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar7].inv != false) {
            pcVar4 = "- ";
          }
          poVar3 = std::operator<<(poVar3,pcVar4);
          pAVar2 = Abc_NtkPi(pNtk2,(pvVar8->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl
                                   .super__Vector_impl_data._M_start[uVar7].id);
          pcVar4 = Abc_ObjName(pAVar2);
          poVar3 = std::operator<<(poVar3,pcVar4);
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        poVar3 = std::operator<<((ostream *)&f,"END");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
    }
    if ((constGroup->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
        super__Vector_impl_data._M_finish !=
        (constGroup->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      poVar3 = std::operator<<((ostream *)&f,"CONST0GROUP");
      std::endl<char,std::char_traits<char>>(poVar3);
      for (uVar7 = 0;
          uVar7 < (ulong)((long)(constGroup->super__Vector_base<Node,_std::allocator<Node>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(constGroup->super__Vector_base<Node,_std::allocator<Node>_>).
                                _M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
        poVar3 = std::operator<<((ostream *)&f,"2 ");
        pcVar4 = "+ ";
        if ((constGroup->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar7].inv != false) {
          pcVar4 = "- ";
        }
        poVar3 = std::operator<<(poVar3,pcVar4);
        pAVar2 = Abc_NtkPi(pNtk2,(constGroup->super__Vector_base<Node,_std::allocator<Node>_>).
                                 _M_impl.super__Vector_impl_data._M_start[uVar7].id);
        pcVar4 = Abc_ObjName(pAVar2);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      poVar3 = std::operator<<((ostream *)&f,"END");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      poVar3 = std::operator<<((ostream *)&std::cout,"Create \"");
      poVar3 = std::operator<<(poVar3,filename);
      poVar3 = std::operator<<(poVar3,"\" success!");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&f);
  }
  return iVar6;
}

Assistant:

int Bmatch_Output( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, vector<Node> * inGroup, vector<Node> * outGroup, vector<Node> * constGroup, const int & maxScore, const char* filename )
{    
    // For loops
    int i, score = 0;
    Abc_Obj_t * pObj;
 
    Abc_NtkForEachPo( pNtk1, pObj, i )
    {
        if(outGroup[i].size()){
            score += 11 + outGroup[i].size();
        }
    }    
    if( score <= maxScore )
        return score;

    ofstream f(filename);
    // ostream & f = cout; // For debugging
    
    Abc_NtkForEachPo( pNtk1, pObj, i )
    {
        if(outGroup[i].size())
        {
            f << "OUTGROUP" << endl;
            f << "1 + " << Abc_ObjName( pObj ) << endl;
            for (int j = 0; j < outGroup[i].size(); ++j)
                f << "2 " << (outGroup[i][j].inv ? "- " : "+ ") <<  Abc_ObjName( Abc_NtkPo(pNtk2, outGroup[i][j].id) ) << endl;
            f << "END" << endl;
        }
    }

    Abc_NtkForEachPi( pNtk1, pObj, i )
    {
        if(inGroup[i].size())
        {
            f << "INGROUP" << endl;
            f << "1 + " << Abc_ObjName( pObj ) << endl;
            for (int j = 0; j < inGroup[i].size(); ++j)
                f << "2 " << (inGroup[i][j].inv ? "- " : "+ ") <<  Abc_ObjName( Abc_NtkPi(pNtk2, inGroup[i][j].id) ) << endl;
            f << "END" << endl;
        }
    }

    if((*constGroup).size())
    {
        f << "CONST0GROUP" << endl;
        for (int j = 0; j < (*constGroup).size(); ++j)
            f << "2 " << ((*constGroup)[j].inv ? "- " : "+ ") << Abc_ObjName( Abc_NtkPi(pNtk2, (*constGroup)[j].id) ) << endl;
        f << "END" << endl;
    }

    if (f.is_open()) cout << "Create \"" << filename << "\" success!" << endl;
    f.close();
    return score;
}